

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

int messagesender_open(MESSAGE_SENDER_HANDLE message_sender)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x32a;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"messagesender_open",0x329,1,"NULL message_sender");
    }
  }
  else {
    iVar3 = 0;
    if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_IDLE) {
      set_message_sender_state(message_sender,MESSAGE_SENDER_STATE_OPENING);
      iVar3 = 0;
      iVar1 = link_attach(message_sender->link,(ON_TRANSFER_RECEIVED)0x0,on_link_state_changed,
                          on_link_flow_on,message_sender);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"messagesender_open",0x333,1,"attach link failed");
        }
        set_message_sender_state(message_sender,MESSAGE_SENDER_STATE_ERROR);
        iVar3 = 0x334;
      }
    }
  }
  return iVar3;
}

Assistant:

int messagesender_open(MESSAGE_SENDER_HANDLE message_sender)
{
    int result;

    if (message_sender == NULL)
    {
        LogError("NULL message_sender");
        result = MU_FAILURE;
    }
    else
    {
        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_IDLE)
        {
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_OPENING);
            if (link_attach(message_sender->link, NULL, on_link_state_changed, on_link_flow_on, message_sender) != 0)
            {
                LogError("attach link failed");
                result = MU_FAILURE;
                set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
            }
            else
            {
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}